

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::AddWeak
          (RepeatedPtrFieldBase *this,MessageLite *prototype)

{
  int iVar1;
  ArenaImpl *in_RSI;
  _func_void_void_ptr *in_RDI;
  MessageLite *result;
  size_t n;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  ImplicitWeakMessage *in_stack_ffffffffffffff50;
  type_info *ptr;
  type_info *allocated_type;
  ArenaImpl *in_stack_ffffffffffffff60;
  ImplicitWeakMessage *local_98;
  size_t in_stack_ffffffffffffff78;
  ImplicitWeakMessage *local_70;
  ImplicitWeakMessage *local_38;
  
  if ((*(size_t *)(in_RDI + 0x10) == 0) || (**(int **)(in_RDI + 0x10) <= *(int *)(in_RDI + 8))) {
    if ((*(size_t *)(in_RDI + 0x10) == 0) || (**(int **)(in_RDI + 0x10) == *(int *)(in_RDI + 0xc)))
    {
      Reserve((RepeatedPtrFieldBase *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    }
    **(int **)(in_RDI + 0x10) = **(int **)(in_RDI + 0x10) + 1;
    if (in_RSI == (ArenaImpl *)0x0) {
      ptr = *(type_info **)in_RDI;
      if (ptr == (type_info *)0x0) {
        local_38 = (ImplicitWeakMessage *)operator_new(0x30);
        ImplicitWeakMessage::ImplicitWeakMessage(in_stack_ffffffffffffff50);
      }
      else {
        allocated_type = ptr;
        AlignUpTo8(0x30);
        ArenaImpl::RecordAlloc(in_stack_ffffffffffffff60,allocated_type,(size_t)ptr);
        ArenaImpl::AllocateAlignedAndAddCleanup(in_RSI,in_stack_ffffffffffffff78,in_RDI);
        local_38 = Arena::InternalHelper<google::protobuf::internal::ImplicitWeakMessage>::
                   Construct<google::protobuf::Arena*>
                             (ptr,(Arena **)
                                  CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      }
      local_98 = local_38;
    }
    else {
      local_98 = (ImplicitWeakMessage *)
                 (*(code *)((in_RSI->threads_)._M_b._M_p)->next_)(in_RSI,*(size_t *)in_RDI);
    }
    iVar1 = *(int *)(in_RDI + 8);
    *(int *)(in_RDI + 8) = iVar1 + 1;
    *(ImplicitWeakMessage **)(*(size_t *)(in_RDI + 0x10) + 8 + (long)iVar1 * 8) = local_98;
    local_70 = local_98;
  }
  else {
    iVar1 = *(int *)(in_RDI + 8);
    *(int *)(in_RDI + 8) = iVar1 + 1;
    local_70 = *(ImplicitWeakMessage **)(*(size_t *)(in_RDI + 0x10) + 8 + (long)iVar1 * 8);
  }
  return &local_70->super_MessageLite;
}

Assistant:

MessageLite* RepeatedPtrFieldBase::AddWeak(const MessageLite* prototype) {
  if (rep_ != NULL && current_size_ < rep_->allocated_size) {
    return reinterpret_cast<MessageLite*>(rep_->elements[current_size_++]);
  }
  if (!rep_ || rep_->allocated_size == total_size_) {
    Reserve(total_size_ + 1);
  }
  ++rep_->allocated_size;
  MessageLite* result = prototype
                            ? prototype->New(arena_)
                            : Arena::CreateMessage<ImplicitWeakMessage>(arena_);
  rep_->elements[current_size_++] = result;
  return result;
}